

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void unodb::detail::
     basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
     ::dump_node(ostream *os,basic_node_ptr<unodb::detail::olc_node_header> *node,bool recursive)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"node at: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,", tagged ptr = 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if (node->tagged_ptr != 0) {
    std::operator<<(os,", type = ");
    switch((uint)node->tagged_ptr & 7) {
    case 0:
      std::operator<<(os,"LEAF");
      basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::dump
                ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                 (node->tagged_ptr & 0xfffffffffffffff8),os,recursive);
      return;
    case 1:
      std::operator<<(os,"I4");
      olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                ((olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                 (node->tagged_ptr & 0xfffffffffffffff8),os,recursive);
      return;
    case 2:
      std::operator<<(os,"I16");
      olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                ((olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                 )(node->tagged_ptr & 0xfffffffffffffff8),os,recursive);
      return;
    case 3:
      std::operator<<(os,"I48");
      olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                ((olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
                 )(node->tagged_ptr & 0xfffffffffffffff8),os,recursive);
      return;
    case 4:
      std::operator<<(os,"I256");
      olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                ((olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *)(node->tagged_ptr & 0xfffffffffffffff8),os,recursive);
      return;
    default:
      return;
    }
  }
  std::operator<<(os,'\n');
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE static void dump_node(
      std::ostream &os, const NodePtr &node, bool recursive = true) {
    os << "node at: " << node.template ptr<void *>() << ", tagged ptr = 0x"
       << std::hex << node.raw_val() << std::dec;
    if (node == nullptr) {
      os << '\n';
      return;
    }
    os << ", type = ";
    switch (node.type()) {
      case node_type::LEAF:
        os << "LEAF";
        node.template ptr<leaf_type *>()->dump(os, recursive);
        break;
      case node_type::I4:
        os << "I4";
        node.template ptr<inode4_type *>()->dump(os, recursive);
        break;
      case node_type::I16:
        os << "I16";
        node.template ptr<inode16_type *>()->dump(os, recursive);
        break;
      case node_type::I48:
        os << "I48";
        node.template ptr<inode48_type *>()->dump(os, recursive);
        break;
      case node_type::I256:
        os << "I256";
        node.template ptr<inode256_type *>()->dump(os, recursive);
        break;
    }
  }